

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.hpp
# Opt level: O1

method_result __thiscall
boost::python::override::operator()
          (override *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a0,
          uint *a1)

{
  pointer pcVar1;
  handle<_object> hVar2;
  long *plVar3;
  long lVar4;
  undefined4 *in_RCX;
  handle<_object> local_28;
  
  pcVar1 = (a0->_M_dataplus)._M_p;
  converter::
  arg_to_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  arg_to_python((arg_to_python<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_28,(string *)a1);
  hVar2.m_p = local_28.m_p;
  plVar3 = (long *)PyLong_FromUnsignedLong(*in_RCX);
  if (plVar3 == (long *)0x0) {
    throw_error_already_set();
  }
  lVar4 = PyEval_CallFunction(pcVar1,"(OO)",hVar2.m_p,plVar3);
  if (lVar4 == 0) {
    throw_error_already_set();
  }
  *(long *)this = lVar4;
  if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
    _Py_Dealloc();
  }
  if ((local_28.m_p != (_object *)0x0) &&
     ((local_28.m_p)->ob_refcnt = (local_28.m_p)->ob_refcnt + -1, (local_28.m_p)->ob_refcnt == 0)) {
    _Py_Dealloc();
  }
  return (method_result)(handle<_object>)this;
}

Assistant:

detail::method_result
operator()( BOOST_PP_ENUM_BINARY_PARAMS_Z(1, N, A, const& a) ) const
{
    detail::method_result x(
        PyEval_CallFunction(
            this->ptr()
          , const_cast<char*>("(" BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_FIXED, "O") ")")
            BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_fast_arg_to_python_get, nil)
        ));
    return x;
}